

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkTSDA::IntStateGather
          (ChLinkTSDA *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  int iVar1;
  Type TStack_68;
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if (((char)iVar1 != '\0') && (this->m_variables != (ChVariablesGenericDiagonalMass *)0x0)) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&TStack_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x,(ulong)off_x,
               this->m_nstates);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::setZero
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &TStack_68);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&TStack_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)v,(ulong)off_v,
               this->m_nstates);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&TStack_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               &this->m_states);
    *T = (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  }
  return;
}

Assistant:

void ChLinkTSDA::IntStateGather(const unsigned int off_x,  // offset in x state vector
                                ChState& x,                // state vector, position part
                                const unsigned int off_v,  // offset in v state vector
                                ChStateDelta& v,           // state vector, speed part
                                double& T                  // time
) {
    if (!IsActive())
        return;

    if (m_variables) {
        x.segment(off_x, m_nstates).setZero();
        v.segment(off_v, m_nstates) = m_states;
        T = GetChTime();
    }
}